

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O1

string * __thiscall
cmCMakePresetsErrors::getVariableName_abi_cxx11_
          (string *__return_storage_ptr__,cmCMakePresetsErrors *this,cmJSONState *state)

{
  cmJSONState *state_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string var;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  pointer local_60;
  undefined8 local_58;
  size_type local_50;
  char *local_48;
  string *local_40;
  undefined8 local_38;
  char *local_30;
  undefined8 local_28;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"cacheVariables","");
  cmJSONState::key_after(&local_c0,(cmJSONState *)this,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  local_80._M_dataplus._M_p = (pointer)0xa;
  local_80._M_string_length = 0x834599;
  local_80.field_2._M_allocated_capacity = 0;
  local_80.field_2._8_8_ = local_c0._M_string_length;
  local_60 = local_c0._M_dataplus._M_p;
  local_58 = 0;
  local_50 = 1;
  local_48 = "\"";
  local_40 = (string *)0x0;
  views._M_len = 3;
  views._M_array = (iterator)&local_80;
  cmCatViews(__return_storage_ptr__,views);
  getPresetName_abi_cxx11_(&local_e0,this,state_00);
  local_80._M_string_length = (size_type)(__return_storage_ptr__->_M_dataplus)._M_p;
  local_80._M_dataplus._M_p = (pointer)__return_storage_ptr__->_M_string_length;
  local_80.field_2._M_allocated_capacity = 0;
  local_80.field_2._8_8_ = 0xd;
  local_60 = " for preset \"";
  local_58 = 0;
  local_50 = local_e0._M_string_length;
  local_48 = local_e0._M_dataplus._M_p;
  local_38 = 1;
  local_30 = "\"";
  local_28 = 0;
  views_00._M_len = 4;
  views_00._M_array = (iterator)&local_80;
  local_40 = &local_e0;
  cmCatViews(&local_a0,views_00);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getVariableName(cmJSONState* state)
{
  std::string var = state->key_after("cacheVariables");
  std::string errMsg = cmStrCat("variable \"", var, "\"");
  errMsg = cmStrCat(errMsg, " for preset \"", getPresetName(state), "\"");
  return errMsg;
}